

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  Descriptor *this_00;
  DynamicMessageFactory *pDVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  undefined4 uVar5;
  CppStringType CVar6;
  ThreadSafeArena *this_01;
  undefined4 *puVar7;
  ExtensionSet *this_02;
  FieldDescriptor *field_00;
  DynamicMapField *this_03;
  TaggedPtr TVar8;
  EnumValueDescriptor *this_04;
  Descriptor *pDVar9;
  FieldDescriptor *this_05;
  Descriptor *pDVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float fVar11;
  double dVar12;
  string_view src;
  Message *local_140;
  Message *local_138;
  Message *local_118;
  Descriptor *sub;
  ArenaStringPtr *asp;
  void *field_ptr;
  FieldDescriptor *field;
  int local_50;
  int i_1;
  int i;
  int oneof_count;
  Arena *arena;
  Descriptor *descriptor;
  bool lock_factory_local;
  DynamicMessage *this_local;
  
  this_00 = (this->type_info_->class_data).descriptor;
  this_01 = &MessageLite::GetArena((MessageLite *)this)->impl_;
  i_1 = 0;
  for (local_50 = 0; iVar3 = Descriptor::real_oneof_decl_count(this_00), local_50 < iVar3;
      local_50 = local_50 + 1) {
    puVar7 = (undefined4 *)MutableOneofCaseRaw(this,i_1);
    *puVar7 = 0;
    i_1 = i_1 + 1;
  }
  if (this->type_info_->extensions_offset != -1) {
    this_02 = (ExtensionSet *)MutableExtensionsRaw(this);
    internal::ExtensionSet::ExtensionSet(this_02,(Arena *)this_01);
  }
  field._4_4_ = 0;
  do {
    iVar3 = Descriptor::field_count(this_00);
    if (iVar3 <= field._4_4_) {
      return;
    }
    field_00 = Descriptor::field(this_00,field._4_4_);
    this_03 = (DynamicMapField *)MutableRaw<void>(this,field._4_4_);
    bVar2 = protobuf::anon_unknown_0::InRealOneof(field_00);
    if (!bVar2) {
      CVar4 = FieldDescriptor::cpp_type(field_00);
      switch(CVar4) {
      case CPPTYPE_INT32:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_03,(Arena *)this_01);
        }
        else {
          uVar5 = FieldDescriptor::default_value_int32_t(field_00);
          *(undefined4 *)&(this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               uVar5;
        }
        break;
      case CPPTYPE_INT64:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<long>::RepeatedField((RepeatedField<long> *)this_03,(Arena *)this_01);
        }
        else {
          TVar8 = FieldDescriptor::default_value_int64_t(field_00);
          (this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = TVar8;
        }
        break;
      case CPPTYPE_UINT32:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<unsigned_int>::RepeatedField
                    ((RepeatedField<unsigned_int> *)this_03,(Arena *)this_01);
        }
        else {
          uVar5 = FieldDescriptor::default_value_uint32_t(field_00);
          *(undefined4 *)&(this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               uVar5;
        }
        break;
      case CPPTYPE_UINT64:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<unsigned_long>::RepeatedField
                    ((RepeatedField<unsigned_long> *)this_03,(Arena *)this_01);
        }
        else {
          TVar8 = FieldDescriptor::default_value_uint64_t(field_00);
          (this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = TVar8;
        }
        break;
      case CPPTYPE_DOUBLE:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<double>::RepeatedField((RepeatedField<double> *)this_03,(Arena *)this_01);
        }
        else {
          dVar12 = FieldDescriptor::default_value_double(field_00);
          (this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = (TaggedPtr)dVar12
          ;
        }
        break;
      case CPPTYPE_FLOAT:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<float>::RepeatedField((RepeatedField<float> *)this_03,(Arena *)this_01);
        }
        else {
          fVar11 = FieldDescriptor::default_value_float(field_00);
          *(float *)&(this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = fVar11
          ;
        }
        break;
      case CPPTYPE_BOOL:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)this_03,(Arena *)this_01);
        }
        else {
          bVar2 = FieldDescriptor::default_value_bool(field_00);
          *(bool *)&(this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = bVar2;
        }
        break;
      case CPPTYPE_ENUM:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_03,(Arena *)this_01);
        }
        else {
          this_04 = FieldDescriptor::default_value_enum(field_00);
          uVar5 = EnumValueDescriptor::number(this_04);
          *(undefined4 *)&(this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               uVar5;
        }
        break;
      case CPPTYPE_STRING:
        CVar6 = FieldDescriptor::cpp_string_type(field_00);
        if (CVar6 == kView) {
LAB_006e765b:
          bVar2 = FieldDescriptor::is_repeated(field_00);
          if (bVar2) {
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)this_03,(Arena *)this_01);
          }
          else {
            memset(this_03,0,8);
            internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)this_03);
          }
        }
        else if (CVar6 == kCord) {
          bVar2 = FieldDescriptor::is_repeated(field_00);
          if (bVar2) {
            RepeatedField<absl::lts_20250127::Cord>::RepeatedField
                      ((RepeatedField<absl::lts_20250127::Cord> *)this_03,(Arena *)this_01);
            if ((this_01 != (ThreadSafeArena *)0x0) && (this_03 != (DynamicMapField *)0x0)) {
              internal::ThreadSafeArena::AddCleanup
                        (this_01,this_03,
                         internal::cleanup::
                         arena_destruct_object<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                        );
            }
          }
          else {
            bVar2 = FieldDescriptor::has_default_value(field_00);
            if (bVar2) {
              src = FieldDescriptor::default_value_string(field_00);
              absl::lts_20250127::Cord::Cord((Cord *)this_03,src);
            }
            else {
              absl::lts_20250127::Cord::Cord((Cord *)this_03);
            }
            if ((this_01 != (ThreadSafeArena *)0x0) && (this_03 != (DynamicMapField *)0x0)) {
              internal::ThreadSafeArena::AddCleanup
                        (this_01,this_03,
                         internal::cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
            }
          }
        }
        else if (CVar6 == kString) goto LAB_006e765b;
        break;
      case CPPTYPE_MESSAGE:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          bVar2 = protobuf::anon_unknown_0::IsMapFieldInApi(field_00);
          if (bVar2) {
            pDVar9 = FieldDescriptor::message_type(field_00);
            this_05 = Descriptor::map_value(pDVar9);
            pDVar9 = FieldDescriptor::message_type(this_05);
            if (lock_factory) {
              pDVar1 = this->type_info_->factory;
              pDVar10 = FieldDescriptor::message_type(field_00);
              iVar3 = (*(pDVar1->super_MessageFactory)._vptr_MessageFactory[2])(pDVar1,pDVar10);
              local_118 = (Message *)CONCAT44(extraout_var,iVar3);
            }
            else {
              pDVar1 = this->type_info_->factory;
              pDVar10 = FieldDescriptor::message_type(field_00);
              local_118 = DynamicMessageFactory::GetPrototypeNoLock(pDVar1,pDVar10);
            }
            if (pDVar9 == (Descriptor *)0x0) {
              local_140 = (Message *)0x0;
            }
            else {
              if (lock_factory) {
                pDVar1 = this->type_info_->factory;
                iVar3 = (*(pDVar1->super_MessageFactory)._vptr_MessageFactory[2])(pDVar1,pDVar9);
                local_138 = (Message *)CONCAT44(extraout_var_00,iVar3);
              }
              else {
                local_138 = DynamicMessageFactory::GetPrototypeNoLock
                                      (this->type_info_->factory,pDVar9);
              }
              local_140 = local_138;
            }
            internal::DynamicMapField::DynamicMapField(this_03,local_118,local_140,(Arena *)this_01)
            ;
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_03,(Arena *)this_01);
          }
        }
        else {
          (this_03->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
        }
      }
    }
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->class_data.descriptor;
  Arena* arena = GetArena();
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->real_oneof_decl_count(); ++i) {
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(arena);
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                         \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                 \
    if (!field->is_repeated()) {                           \
      new (field_ptr) TYPE(field->default_value_##TYPE()); \
    } else {                                               \
      new (field_ptr) RepeatedField<TYPE>(arena);          \
    }                                                      \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(arena);
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            if (!field->is_repeated()) {
              if (field->has_default_value()) {
                new (field_ptr) absl::Cord(field->default_value_string());
              } else {
                new (field_ptr) absl::Cord;
              }
              if (arena != nullptr) {
                // Cord does not support arena so here we need to notify arena
                // to remove the data it allocated on the heap by calling its
                // destructor.
                arena->OwnDestructor(static_cast<absl::Cord*>(field_ptr));
              }
            } else {
              new (field_ptr) RepeatedField<absl::Cord>(arena);
              if (arena != nullptr) {
                // Needs to destroy Cord elements.
                arena->OwnDestructor(
                    static_cast<RepeatedField<absl::Cord>*>(field_ptr));
              }
            }
            break;
          case FieldDescriptor::CppStringType::kView:
            if (internal::EnableExperimentalMicroString() &&
                !field->is_repeated()) {
              auto* str = ::new (MutableRaw<MicroString>(i)) MicroString();
              if (field->has_default_value()) {
                // TODO: Use an unowned block instead.
                str->Set(field->default_value_string(), arena);
              }
              break;
            }
            [[fallthrough]];
          case FieldDescriptor::CppStringType::kString:
            if (!field->is_repeated()) {
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->InitDefault();
            } else {
              new (field_ptr) RepeatedPtrField<std::string>(arena);
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            const auto* sub =
                field->message_type()->map_value()->message_type();
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            new (field_ptr) DynamicMapField(
                lock_factory
                    ? type_info_->factory->GetPrototype(field->message_type())
                    : type_info_->factory->GetPrototypeNoLock(
                          field->message_type()),
                sub != nullptr
                    ? lock_factory
                          ? type_info_->factory->GetPrototype(sub)
                          : type_info_->factory->GetPrototypeNoLock(sub)
                    : nullptr,
                arena);
          } else {
            new (field_ptr) RepeatedPtrField<Message>(arena);
          }
        }
        break;
      }
    }
  }
}